

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
 __thiscall
utf8::
utf8to16<std::back_insert_iterator<std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (utf8 *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          start,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,
          back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          result)

{
  bool bVar1;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *pbVar2;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_68;
  value_type local_5a;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_58;
  value_type local_4a;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_48;
  value_type local_3a;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *local_38;
  uint32_t local_2c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_28;
  uint32_t cp;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  result_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  start_local;
  
  _Stack_28._M_current = end._M_current;
  result_local.container =
       (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
       start._M_current;
  end_local._M_current = (char *)this;
  while (bVar1 = __gnu_cxx::operator<
                           (&end_local,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&result_local), bVar1) {
    local_38 = result_local.container;
    local_2c = next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         (&end_local,
                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )result_local.container);
    if (local_2c < 0x10000) {
      local_5a = (value_type)local_2c;
      local_68 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                 ::operator++((back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                               *)&stack0xffffffffffffffd8,0);
      pbVar2 = std::
               back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator*(&local_68);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
      ::operator=(pbVar2,&local_5a);
    }
    else {
      local_3a = (short)(local_2c >> 10) + L'ퟀ';
      local_48 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                 ::operator++((back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                               *)&stack0xffffffffffffffd8,0);
      pbVar2 = std::
               back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator*(&local_48);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
      ::operator=(pbVar2,&local_3a);
      local_4a = ((ushort)local_2c & 0x3ff) + L'\xdc00';
      local_58 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                 ::operator++((back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                               *)&stack0xffffffffffffffd8,0);
      pbVar2 = std::
               back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator*(&local_58);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
      ::operator=(pbVar2,&local_4a);
    }
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          )(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
           _Stack_28._M_current;
}

Assistant:

u16bit_iterator utf8to16 (octet_iterator start, octet_iterator end, u16bit_iterator result)
    {
        while (start < end) {
            uint32_t cp = utf8::next(start, end);
            if (cp > 0xffff) { //make a surrogate pair
                *result++ = static_cast<uint16_t>((cp >> 10)   + internal::LEAD_OFFSET);
                *result++ = static_cast<uint16_t>((cp & 0x3ff) + internal::TRAIL_SURROGATE_MIN);
            }
            else
                *result++ = static_cast<uint16_t>(cp);
        }
        return result;
    }